

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

void __thiscall cppcms::impl::details::basic_map<$d0c7d56a$>::clear(basic_map<_d0c7d56a_> *this)

{
  container *pcVar1;
  range_type *prVar2;
  pointer ppVar3;
  ulong uVar4;
  iterator del;
  container *p;
  bool bVar5;
  
  p = (this->list_).begin;
  ppVar3 = (this->hash_).super__Vector_base<_8fa62532_>._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->hash_).super__Vector_base<_8fa62532_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)ppVar3 >> 4;
  if (this->size_ >> 2 < uVar4) {
    while (p != (iterator)0x0) {
      pcVar1 = p->next;
      p->next = (container *)0x0;
      p->prev = (container *)0x0;
      prVar2 = basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s...r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
               ::
               get<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>>
                         ((basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s___r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
                           *)this,(basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
                                   *)p);
      prVar2->first = (container *)0x0;
      prVar2->second = (container *)0x0;
      destroy(this,p);
      p = pcVar1;
    }
  }
  else {
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      ppVar3->first = (container *)0x0;
      ppVar3->second = (container *)0x0;
      ppVar3 = ppVar3 + 1;
    }
    while (p != (iterator)0x0) {
      pcVar1 = p->next;
      p->next = (container *)0x0;
      p->prev = (container *)0x0;
      destroy(this,p);
      p = pcVar1;
    }
  }
  (this->list_).begin = (container *)0x0;
  (this->list_).end = (container *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

void clear()
	{
		iterator p=list_.begin;
		if(size_ / 4 >= hash_.size()) {
			for(size_t i=0;i<hash_.size();i++) {
				hash_[i].first = 0;
				hash_[i].second = 0;
			}
			while(p) {
				iterator del = p;
				p=p->next;
				del->prev = 0;
				del->next = 0;
				destroy(del);
			}
		}
		else {
			while(p) {
				iterator del = p;
				p=p->next;
				del->prev = 0;
				del->next = 0;
				range_type &r=get(del->val.first);
				r.first = r.second = 0;
				destroy(del);
			}
		}
		list_.begin = list_.end = 0;
		size_ = 0;
	}